

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

bool __thiscall
CLIntercept::overrideGetDeviceInfo
          (CLIntercept *this,cl_device_id device,cl_device_info param_name,size_t param_value_size,
          void *param_value,size_t *param_value_size_ret,cl_int *errorCode)

{
  char *pcVar1;
  __pthread_internal_list *p_Var2;
  undefined1 uVar3;
  bool bVar4;
  cl_uint cVar5;
  int iVar6;
  cl_int cVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  char *pcVar11;
  uint uVar12;
  undefined8 uVar13;
  CLIntercept *this_00;
  string *param;
  void *pvVar14;
  char *pcVar15;
  char cVar16;
  char *ptr;
  char *deviceExtensions;
  cl_device_svm_capabilities svmCaps;
  undefined1 local_58 [32];
  size_t minor;
  
  bVar4 = false;
  switch(param_name) {
  case 0x1000:
    uVar8 = (ulong)(this->m_Config).DeviceType;
    cVar7 = 0;
    if (uVar8 == 0) {
      return false;
    }
    if (param_value != (void *)0x0) {
      if (param_value_size < 8) {
        cVar7 = -0x1e;
      }
      else {
        *(ulong *)param_value = uVar8;
      }
    }
    if (param_value_size_ret != (size_t *)0x0) {
      *param_value_size_ret = 8;
    }
    goto LAB_0017177b;
  case 0x1001:
    cVar5 = (this->m_Config).DeviceVendorID;
    goto LAB_0017165a;
  case 0x1002:
    cVar5 = (this->m_Config).DeviceMaxComputeUnits;
LAB_0017165a:
    if (cVar5 == 0) {
      return false;
    }
    goto LAB_00171758;
  case 0x1003:
  case 0x1004:
  case 0x1005:
    goto switchD_001715a5_caseD_105c;
  case 0x1006:
    cVar5 = (this->m_Config).DevicePreferredVectorWidthChar;
    break;
  case 0x1007:
    cVar5 = (this->m_Config).DevicePreferredVectorWidthShort;
    break;
  case 0x1008:
    cVar5 = (this->m_Config).DevicePreferredVectorWidthInt;
    break;
  case 0x1009:
    cVar5 = (this->m_Config).DevicePreferredVectorWidthLong;
    break;
  case 0x100a:
    cVar5 = (this->m_Config).DevicePreferredVectorWidthFloat;
    break;
  case 0x100b:
    cVar5 = (this->m_Config).DevicePreferredVectorWidthDouble;
    break;
  default:
    switch(param_name) {
    case 0x102b:
      if ((this->m_Config).DeviceName._M_string_length == 0) goto LAB_00171e9b;
      param = &(this->m_Config).DeviceName;
      break;
    case 0x102c:
      if ((this->m_Config).DeviceVendor._M_string_length == 0) goto LAB_00171e9b;
      param = &(this->m_Config).DeviceVendor;
      break;
    case 0x102d:
      if ((this->m_Config).DriverVersion._M_string_length == 0) goto LAB_00171e9b;
      param = &(this->m_Config).DriverVersion;
      break;
    case 0x102e:
      if ((this->m_Config).DeviceProfile._M_string_length == 0) goto LAB_00171e9b;
      param = &(this->m_Config).DeviceProfile;
      break;
    case 0x102f:
      if ((this->m_Config).DeviceVersion._M_string_length == 0) goto LAB_00171e9b;
      param = &(this->m_Config).DeviceVersion;
      break;
    case 0x1030:
      if ((this->m_Config).DeviceExtensions._M_string_length == 0) {
        if (((((this->m_Config).PrependDeviceExtensions._M_string_length != 0) ||
             ((this->m_Config).Emulate_cl_khr_extended_versioning != false)) ||
            ((this->m_Config).Emulate_cl_khr_semaphore != false)) ||
           ((this->m_Config).Emulate_cl_intel_unified_shared_memory == true)) {
          std::__cxx11::string::string
                    ((string *)&svmCaps,(string *)&(this->m_Config).PrependDeviceExtensions);
          if ((local_58._0_8_ != 0) && (*(char *)((svmCaps - 1) + local_58._0_8_) != ' ')) {
            std::__cxx11::string::push_back((char)&svmCaps);
          }
          if (((this->m_Config).Emulate_cl_khr_extended_versioning == true) &&
             (bVar4 = checkDeviceForExtension(this,device,"cl_khr_extended_versioning"), !bVar4)) {
            std::__cxx11::string::append((char *)&svmCaps);
          }
          if (((this->m_Config).Emulate_cl_khr_semaphore == true) &&
             (bVar4 = checkDeviceForExtension(this,device,"cl_khr_semaphore"), !bVar4)) {
            std::__cxx11::string::append((char *)&svmCaps);
          }
          if (((this->m_Config).Emulate_cl_intel_unified_shared_memory == true) &&
             (bVar4 = checkDeviceForExtension(this,device,"cl_intel_unified_shared_memory"), !bVar4)
             ) {
            std::__cxx11::string::append((char *)&svmCaps);
          }
          if (local_58._0_8_ == 0) {
            bVar4 = false;
          }
          else {
            deviceExtensions = (char *)0x0;
            cVar7 = allocateAndGetDeviceInfoString(this,device,0x1030,&deviceExtensions);
            pcVar15 = deviceExtensions;
            bVar4 = deviceExtensions != (char *)0x0 && cVar7 == 0;
            if (deviceExtensions != (char *)0x0 && cVar7 == 0) {
              this_00 = (CLIntercept *)&svmCaps;
              std::__cxx11::string::append((char *)this_00);
              writeStringToMemory(this_00,param_value_size,(string *)&svmCaps,param_value_size_ret,
                                  (char *)param_value);
            }
            else if (deviceExtensions == (char *)0x0) goto LAB_00171f6b;
            operator_delete__(pcVar15);
          }
LAB_00171f6b:
          std::__cxx11::string::~string((string *)&svmCaps);
          return bVar4;
        }
        goto LAB_00171e9b;
      }
      param = &(this->m_Config).DeviceExtensions;
      break;
    case 0x1031:
    case 0x1032:
    case 0x1033:
    case 0x1035:
    case 0x1036:
    case 0x1037:
    case 0x1038:
    case 0x1039:
    case 0x103a:
    case 0x103b:
    case 0x103c:
      goto switchD_001715a5_caseD_105c;
    case 0x1034:
      cVar5 = (this->m_Config).DevicePreferredVectorWidthHalf;
      goto LAB_0017174d;
    case 0x103d:
      if ((this->m_Config).DeviceCVersion._M_string_length == 0) goto LAB_00171e9b;
      param = &(this->m_Config).DeviceCVersion;
      break;
    default:
      ptr = (char *)param_value;
      local_58._24_8_ = param_value_size_ret;
      switch(param_name) {
      case 0x105b:
        if ((this->m_Config).DeviceILVersion._M_string_length != 0) {
          param = &(this->m_Config).DeviceILVersion;
          goto LAB_0017172b;
        }
        break;
      case 0x105c:
      case 0x105d:
        goto switchD_001715a5_caseD_105c;
      case 0x105e:
        if ((this->m_Config).Emulate_cl_khr_extended_versioning == true) {
          svmCaps = 0;
          cVar7 = allocateAndGetDeviceInfoString(this,device,0x102f,(char **)&svmCaps);
          *errorCode = cVar7;
          bVar4 = svmCaps != 0 && cVar7 == 0;
          if (svmCaps == 0 || cVar7 != 0) {
LAB_00171c23:
            pvVar14 = (void *)svmCaps;
            if (svmCaps == 0) {
              return bVar4;
            }
            goto LAB_00171f20;
          }
          pcVar15 = "OpenCL ";
LAB_001718d3:
          pvVar14 = (void *)svmCaps;
          minor = 0;
          deviceExtensions = (char *)0x0;
          getMajorMinorVersionFromString
                    (this,pcVar15,(char *)svmCaps,(size_t *)&deviceExtensions,&minor);
          cVar7 = 0;
          if (param_value != (void *)0x0) {
            if (param_value_size < 4) {
              cVar7 = -0x1e;
            }
            else {
              *(uint *)param_value = ((uint)minor & 0x3ff) << 0xc | (int)deviceExtensions << 0x16;
            }
          }
          if (param_value_size_ret != (size_t *)0x0) {
            *param_value_size_ret = 4;
          }
          *errorCode = cVar7;
LAB_00171f20:
          operator_delete__(pvVar14);
          return bVar4;
        }
        break;
      case 0x105f:
        if ((this->m_Config).Emulate_cl_khr_extended_versioning == true) {
          svmCaps = 0;
          cVar7 = allocateAndGetDeviceInfoString(this,device,0x103d,(char **)&svmCaps);
          *errorCode = cVar7;
          bVar4 = svmCaps != 0 && cVar7 == 0;
          if (svmCaps == 0 || cVar7 != 0) goto LAB_00171c23;
          pcVar15 = "OpenCL C ";
          goto LAB_001718d3;
        }
        break;
      case 0x1060:
        if ((this->m_Config).Emulate_cl_khr_extended_versioning != true) break;
        svmCaps = (cl_device_svm_capabilities)(local_58 + 8);
        local_58._0_8_ = 0;
        local_58[8] = '\0';
        bVar4 = checkDeviceForExtension(this,device,"cl_khr_extended_versioning");
        if (!bVar4) {
          std::__cxx11::string::append((char *)&svmCaps);
        }
        if (((this->m_Config).Emulate_cl_intel_unified_shared_memory == true) &&
           (bVar4 = checkDeviceForExtension(this,device,"cl_intel_unified_shared_memory"), !bVar4))
        {
          std::__cxx11::string::append((char *)&svmCaps);
        }
        deviceExtensions = (char *)0x0;
        allocateAndGetDeviceInfoString(this,device,0x1030,&deviceExtensions);
        pcVar15 = deviceExtensions;
        std::__cxx11::string::append((char *)&svmCaps);
        cVar7 = parseExtensionString
                          ((char *)svmCaps,(cl_name_version_khr *)param_value,param_value_size,
                           param_value_size_ret);
        *errorCode = cVar7;
        if (pcVar15 != (char *)0x0) {
          operator_delete__(pcVar15);
        }
        std::__cxx11::string::~string((string *)&svmCaps);
        goto LAB_00171f42;
      case 0x1061:
        uVar8 = 0;
        if ((this->m_Config).Emulate_cl_khr_extended_versioning != true) {
          return false;
        }
        svmCaps = 0;
        allocateAndGetDeviceInfoString(this,device,0x105b,(char **)&svmCaps);
        pcVar15 = (char *)svmCaps;
        pcVar11 = (char *)svmCaps;
        while ((p_Var2 = (__pthread_internal_list *)local_58._24_8_, pcVar11 != (char *)0x0 &&
               (cVar16 = *pcVar11, cVar16 != '\0'))) {
          while (iVar6 = isspace((int)cVar16), iVar6 != 0) {
            cVar16 = pcVar11[1];
            pcVar11 = pcVar11 + 1;
          }
          if (cVar16 != '\0') {
            while ((cVar16 != '\0' && (iVar6 = isspace((int)cVar16), iVar6 == 0))) {
              cVar16 = pcVar11[1];
              pcVar11 = pcVar11 + 1;
            }
            uVar8 = (ulong)((int)uVar8 + 1);
          }
        }
        if (param_value == (void *)0x0) {
          cVar7 = 0;
        }
        else if (uVar8 * 0x44 < param_value_size || uVar8 * 0x44 - param_value_size == 0) {
          while ((cVar7 = 0, pcVar15 != (char *)0x0 &&
                 (cVar16 = *pcVar15, pcVar11 = pcVar15, cVar16 != '\0'))) {
            while( true ) {
              pcVar11 = pcVar11 + 1;
              iVar6 = isspace((int)cVar16);
              if (iVar6 == 0) break;
              cVar16 = pcVar15[1];
              pcVar15 = pcVar15 + 1;
            }
            if (cVar16 != '\0') {
              ptr[0x34] = '\0';
              ptr[0x35] = '\0';
              ptr[0x36] = '\0';
              ptr[0x37] = '\0';
              ptr[0x38] = '\0';
              ptr[0x39] = '\0';
              ptr[0x3a] = '\0';
              ptr[0x3b] = '\0';
              ptr[0x3c] = '\0';
              ptr[0x3d] = '\0';
              ptr[0x3e] = '\0';
              ptr[0x3f] = '\0';
              ptr[0x40] = '\0';
              ptr[0x41] = '\0';
              ptr[0x42] = '\0';
              ptr[0x43] = '\0';
              ptr[0x24] = '\0';
              ptr[0x25] = '\0';
              ptr[0x26] = '\0';
              ptr[0x27] = '\0';
              ptr[0x28] = '\0';
              ptr[0x29] = '\0';
              ptr[0x2a] = '\0';
              ptr[0x2b] = '\0';
              ptr[0x2c] = '\0';
              ptr[0x2d] = '\0';
              ptr[0x2e] = '\0';
              ptr[0x2f] = '\0';
              ptr[0x30] = '\0';
              ptr[0x31] = '\0';
              ptr[0x32] = '\0';
              ptr[0x33] = '\0';
              ptr[0x14] = '\0';
              ptr[0x15] = '\0';
              ptr[0x16] = '\0';
              ptr[0x17] = '\0';
              ptr[0x18] = '\0';
              ptr[0x19] = '\0';
              ptr[0x1a] = '\0';
              ptr[0x1b] = '\0';
              ptr[0x1c] = '\0';
              ptr[0x1d] = '\0';
              ptr[0x1e] = '\0';
              ptr[0x1f] = '\0';
              ptr[0x20] = '\0';
              ptr[0x21] = '\0';
              ptr[0x22] = '\0';
              ptr[0x23] = '\0';
              ptr[4] = '\0';
              ptr[5] = '\0';
              ptr[6] = '\0';
              ptr[7] = '\0';
              ptr[8] = '\0';
              ptr[9] = '\0';
              ptr[10] = '\0';
              ptr[0xb] = '\0';
              ptr[0xc] = '\0';
              ptr[0xd] = '\0';
              ptr[0xe] = '\0';
              ptr[0xf] = '\0';
              ptr[0x10] = '\0';
              ptr[0x11] = '\0';
              ptr[0x12] = '\0';
              ptr[0x13] = '\0';
              uVar9 = 0;
              while (((cVar16 = pcVar15[uVar9], cVar16 != '\0' && (cVar16 != '_')) &&
                     (iVar6 = isspace((int)cVar16), iVar6 == 0))) {
                if (uVar9 < 0x40) {
                  ptr[uVar9 + 4] = cVar16;
                }
                uVar9 = uVar9 + 1;
                pcVar11 = pcVar11 + 1;
              }
              ptr[0x43] = '\0';
              if (pcVar15[uVar9] == '_') {
                iVar6 = 0;
                while( true ) {
                  uVar10 = (int)*pcVar11 - 0x30;
                  if (9 < uVar10) break;
                  iVar6 = uVar10 + iVar6 * 10;
                  pcVar11 = pcVar11 + 1;
                }
                pcVar15 = pcVar11 + 1;
                if (*pcVar11 != '.') {
                  pcVar15 = pcVar11;
                }
                uVar10 = 0;
                while( true ) {
                  uVar12 = (int)*pcVar15 - 0x30;
                  if (9 < uVar12) break;
                  uVar10 = uVar12 + uVar10 * 10;
                  pcVar15 = pcVar15 + 1;
                }
                uVar12 = 0;
                for (pcVar15 = pcVar15 + (*pcVar15 == '.'); (int)*pcVar15 - 0x30U < 10;
                    pcVar15 = pcVar15 + 1) {
                  uVar12 = ((int)*pcVar15 - 0x30U) + uVar12 * 10;
                }
                uVar10 = uVar12 & 0xfff | (uVar10 & 0x3ff) << 0xc | iVar6 << 0x16;
              }
              else {
                pcVar15 = pcVar15 + uVar9;
                uVar10 = 0;
              }
              *(uint *)ptr = uVar10;
              while ((*pcVar15 != '\0' && (iVar6 = isspace((int)*pcVar15), iVar6 == 0))) {
                pcVar15 = pcVar15 + 1;
              }
              ptr = ptr + 0x44;
            }
          }
        }
        else {
          cVar7 = -0x1e;
        }
        goto joined_r0x00171ed6;
      case 0x1062:
        uVar8 = 0;
        if ((this->m_Config).Emulate_cl_khr_extended_versioning != true) {
          return false;
        }
        svmCaps = 0;
        allocateAndGetDeviceInfoString(this,device,0x103f,(char **)&svmCaps);
        pcVar15 = (char *)svmCaps;
        pcVar11 = (char *)svmCaps;
        while ((p_Var2 = (__pthread_internal_list *)local_58._24_8_, pcVar11 != (char *)0x0 &&
               (cVar16 = *pcVar11, cVar16 != '\0'))) {
          while ((iVar6 = isspace((int)cVar16), cVar16 == ';' || (iVar6 != 0))) {
            cVar16 = pcVar11[1];
            pcVar11 = pcVar11 + 1;
          }
          if (cVar16 != '\0') {
            while ((cVar16 != '\0' && (cVar16 != ';'))) {
              pcVar1 = pcVar11 + 1;
              pcVar11 = pcVar11 + 1;
              cVar16 = *pcVar1;
            }
            uVar8 = (ulong)((int)uVar8 + 1);
          }
        }
        if (param_value == (void *)0x0) {
          cVar7 = 0;
        }
        else if (uVar8 * 0x44 < param_value_size || uVar8 * 0x44 - param_value_size == 0) {
          while ((cVar7 = 0, pcVar15 != (char *)0x0 && (cVar16 = *pcVar15, cVar16 != '\0'))) {
            while ((iVar6 = isspace((int)cVar16), cVar16 == ';' || (iVar6 != 0))) {
              cVar16 = pcVar15[1];
              pcVar15 = pcVar15 + 1;
            }
            if (cVar16 != '\0') {
              ptr[0x30] = '\0';
              ptr[0x31] = '\0';
              ptr[0x32] = '\0';
              ptr[0x33] = '\0';
              ptr[0x34] = '\0';
              ptr[0x35] = '\0';
              ptr[0x36] = '\0';
              ptr[0x37] = '\0';
              ptr[0x38] = '\0';
              ptr[0x39] = '\0';
              ptr[0x3a] = '\0';
              ptr[0x3b] = '\0';
              ptr[0x3c] = '\0';
              ptr[0x3d] = '\0';
              ptr[0x3e] = '\0';
              ptr[0x3f] = '\0';
              ptr[0x20] = '\0';
              ptr[0x21] = '\0';
              ptr[0x22] = '\0';
              ptr[0x23] = '\0';
              ptr[0x24] = '\0';
              ptr[0x25] = '\0';
              ptr[0x26] = '\0';
              ptr[0x27] = '\0';
              ptr[0x28] = '\0';
              ptr[0x29] = '\0';
              ptr[0x2a] = '\0';
              ptr[0x2b] = '\0';
              ptr[0x2c] = '\0';
              ptr[0x2d] = '\0';
              ptr[0x2e] = '\0';
              ptr[0x2f] = '\0';
              ptr[0x10] = '\0';
              ptr[0x11] = '\0';
              ptr[0x12] = '\0';
              ptr[0x13] = '\0';
              ptr[0x14] = '\0';
              ptr[0x15] = '\0';
              ptr[0x16] = '\0';
              ptr[0x17] = '\0';
              ptr[0x18] = '\0';
              ptr[0x19] = '\0';
              ptr[0x1a] = '\0';
              ptr[0x1b] = '\0';
              ptr[0x1c] = '\0';
              ptr[0x1d] = '\0';
              ptr[0x1e] = '\0';
              ptr[0x1f] = '\0';
              ptr[0] = '\0';
              ptr[1] = '\0';
              ptr[2] = '\0';
              ptr[3] = '\0';
              ptr[4] = '\0';
              ptr[5] = '\0';
              ptr[6] = '\0';
              ptr[7] = '\0';
              ptr[8] = '\0';
              ptr[9] = '\0';
              ptr[10] = '\0';
              ptr[0xb] = '\0';
              ptr[0xc] = '\0';
              ptr[0xd] = '\0';
              ptr[0xe] = '\0';
              ptr[0xf] = '\0';
              ptr[0x40] = '\0';
              ptr[0x41] = '\0';
              ptr[0x42] = '\0';
              ptr[0x43] = '\0';
              for (uVar9 = 0; (cVar16 = pcVar15[uVar9], cVar16 != '\0' && (cVar16 != ';'));
                  uVar9 = uVar9 + 1) {
                if (uVar9 < 0x40) {
                  ptr[uVar9 + 4] = cVar16;
                }
              }
              ptr[0x43] = '\0';
              ptr = ptr + 0x44;
              pcVar15 = pcVar15 + uVar9;
            }
          }
        }
        else {
          cVar7 = -0x1e;
        }
joined_r0x00171ed6:
        if (p_Var2 != (__pthread_internal_list *)0x0) {
          p_Var2->__prev = (__pthread_internal_list *)(uVar8 * 0x44);
        }
        *errorCode = cVar7;
        if ((void *)svmCaps != (void *)0x0) {
          operator_delete__((void *)svmCaps);
        }
        goto LAB_00171f42;
      default:
        uVar8 = (ulong)(param_name - 0x4190);
        if (4 < param_name - 0x4190) {
          if (param_name != 0x204c) {
            return false;
          }
          cVar7 = 0;
          if ((this->m_Config).Emulate_cl_khr_semaphore != true) {
            return false;
          }
          if (param_value != (void *)0x0) {
            if (param_value_size < 4) {
              cVar7 = -0x1e;
            }
            else {
              *(undefined4 *)param_value = 1;
            }
          }
          if (param_value_size_ret != (size_t *)0x0) {
            *param_value_size_ret = 4;
          }
          *errorCode = cVar7;
          goto LAB_00171f42;
        }
        if ((this->m_Config).Emulate_cl_intel_unified_shared_memory == true) {
          svmCaps = 0;
          (*(this->m_Dispatch).clGetDeviceInfo)(device,0x1053,8,&svmCaps,(size_t *)0x0);
          if ((svmCaps & 4) == 0) {
            if ((svmCaps & 2) != 0) {
              uVar10 = (uint)svmCaps & 8;
              uVar3 = (*(code *)(&DAT_0018feec + *(int *)(&DAT_0018feec + uVar8 * 4)))
                                (&DAT_0018feec + *(int *)(&DAT_0018feec + uVar8 * 4),0,uVar10 + 3,
                                 uVar10 | 7,param_value);
              return (bool)uVar3;
            }
            uVar10 = -((uint)svmCaps & 1) & 3;
            uVar13 = 0;
          }
          else {
            if ((svmCaps & 8) != 0) {
              uVar3 = (*(code *)(&DAT_0018feec + *(int *)(&DAT_0018feec + uVar8 * 4)))
                                (&DAT_0018feec + *(int *)(&DAT_0018feec + uVar8 * 4),0xf,0xb,0xf,
                                 param_value);
              return (bool)uVar3;
            }
            uVar13 = 7;
            uVar10 = 3;
          }
          uVar3 = (*(code *)(&DAT_0018feec + *(int *)(&DAT_0018feec + uVar8 * 4)))
                            (&DAT_0018feec + *(int *)(&DAT_0018feec + uVar8 * 4),uVar13,uVar10,
                             uVar13);
          return (bool)uVar3;
        }
      }
LAB_00171e9b:
      bVar4 = false;
      goto switchD_001715a5_caseD_105c;
    }
LAB_0017172b:
    cVar7 = writeStringToMemory(this,param_value_size,param,param_value_size_ret,(char *)param_value
                               );
    *errorCode = cVar7;
    goto LAB_00171f42;
  }
LAB_0017174d:
  bVar4 = false;
  if (cVar5 != 0xffffffff) {
LAB_00171758:
    cVar7 = 0;
    if (param_value != (void *)0x0) {
      if (param_value_size < 4) {
        cVar7 = -0x1e;
      }
      else {
        *(cl_uint *)param_value = cVar5;
      }
    }
    if (param_value_size_ret != (size_t *)0x0) {
      *param_value_size_ret = 4;
    }
LAB_0017177b:
    *errorCode = cVar7;
LAB_00171f42:
    bVar4 = true;
  }
switchD_001715a5_caseD_105c:
  return bVar4;
}

Assistant:

bool CLIntercept::overrideGetDeviceInfo(
    cl_device_id device,
    cl_device_info param_name,
    size_t param_value_size,
    void* param_value,
    size_t* param_value_size_ret,
    cl_int& errorCode ) const
{
    bool    override = false;

    switch( param_name )
    {
    case CL_DEVICE_TYPE:
        if( m_Config.DeviceType != 0 )
        {
            cl_device_type* ptr = (cl_device_type*)param_value;
            cl_device_type  d = m_Config.DeviceType;
            errorCode = writeParamToMemory(
                param_value_size,
                d,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_NAME:
        if( !m_Config.DeviceName.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.DeviceName,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_EXTENSIONS:
        if( !m_Config.DeviceExtensions.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.DeviceExtensions,
                param_value_size_ret,
                ptr );
            override = true;
        }
        else if( !m_Config.PrependDeviceExtensions.empty() ||
                 m_Config.Emulate_cl_khr_extended_versioning ||
                 m_Config.Emulate_cl_khr_semaphore ||
                 m_Config.Emulate_cl_intel_unified_shared_memory )
        {
            std::string newExtensions(m_Config.PrependDeviceExtensions);
            if( !newExtensions.empty() && newExtensions.back() != ' ' )
            {
                newExtensions.push_back(' ');
            }
            if( m_Config.Emulate_cl_khr_extended_versioning &&
                !checkDeviceForExtension( device, "cl_khr_extended_versioning") )
            {
                newExtensions += "cl_khr_extended_versioning ";
            }
            if( m_Config.Emulate_cl_khr_semaphore &&
                !checkDeviceForExtension( device, "cl_khr_semaphore") )
            {
                newExtensions += "cl_khr_semaphore ";
            }
            if( m_Config.Emulate_cl_intel_unified_shared_memory &&
                !checkDeviceForExtension( device, "cl_intel_unified_shared_memory") )
            {
                newExtensions += "cl_intel_unified_shared_memory ";
            }

            if( !newExtensions.empty() )
            {
                char*   deviceExtensions = NULL;
                cl_int  errorCode = allocateAndGetDeviceInfoString(
                    device,
                    CL_DEVICE_EXTENSIONS,
                    deviceExtensions );
                if( errorCode == CL_SUCCESS && deviceExtensions )
                {
                    newExtensions += deviceExtensions;

                    char*   ptr = (char*)param_value;
                    errorCode = writeStringToMemory(
                        param_value_size,
                        newExtensions,
                        param_value_size_ret,
                        ptr );
                    override = true;
                }
                delete [] deviceExtensions;
            }
        }
        break;
    case CL_DEVICE_VENDOR:
        if( !m_Config.DeviceVendor.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.DeviceVendor,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_PROFILE:
        if( !m_Config.DeviceProfile.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.DeviceProfile,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_VERSION:
        if( !m_Config.DeviceVersion.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.DeviceVersion,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_OPENCL_C_VERSION:
        if( !m_Config.DeviceCVersion.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.DeviceCVersion,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_IL_VERSION:
        if( !m_Config.DeviceILVersion.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.DeviceILVersion,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_VENDOR_ID:
        if( m_Config.DeviceVendorID != 0 )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DeviceVendorID,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_MAX_COMPUTE_UNITS:
        if( m_Config.DeviceMaxComputeUnits != 0 )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DeviceMaxComputeUnits,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_PREFERRED_VECTOR_WIDTH_CHAR:
        if( m_Config.DevicePreferredVectorWidthChar != UINT_MAX )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DevicePreferredVectorWidthChar,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_PREFERRED_VECTOR_WIDTH_SHORT:
        if( m_Config.DevicePreferredVectorWidthShort != UINT_MAX )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DevicePreferredVectorWidthShort,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_PREFERRED_VECTOR_WIDTH_INT:
        if( m_Config.DevicePreferredVectorWidthInt != UINT_MAX )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DevicePreferredVectorWidthInt,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_PREFERRED_VECTOR_WIDTH_LONG:
        if( m_Config.DevicePreferredVectorWidthLong != UINT_MAX )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DevicePreferredVectorWidthLong,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_PREFERRED_VECTOR_WIDTH_HALF:
        if( m_Config.DevicePreferredVectorWidthHalf != UINT_MAX )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DevicePreferredVectorWidthHalf,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_PREFERRED_VECTOR_WIDTH_FLOAT:
        if( m_Config.DevicePreferredVectorWidthFloat != UINT_MAX )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DevicePreferredVectorWidthFloat,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_PREFERRED_VECTOR_WIDTH_DOUBLE:
        if( m_Config.DevicePreferredVectorWidthDouble != UINT_MAX )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DevicePreferredVectorWidthDouble,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_NUMERIC_VERSION_KHR:
        if( m_Config.Emulate_cl_khr_extended_versioning )
        {
            char*   deviceVersion = NULL;

            errorCode = allocateAndGetDeviceInfoString(
                device,
                CL_DEVICE_VERSION,
                deviceVersion );
            if( errorCode == CL_SUCCESS && deviceVersion )
            {
                // According to the spec, the device version string should have the form:
                //   OpenCL <Major>.<Minor> <Vendor Specific Info>
                size_t  major = 0;
                size_t  minor = 0;
                if( getMajorMinorVersionFromString(
                        "OpenCL ",
                        deviceVersion,
                        major,
                        minor ) )
                {
                    cl_version_khr* ptr = (cl_version_khr*)param_value;
                    cl_version_khr  version = CL_MAKE_VERSION_KHR( major, minor, 0 );
                    errorCode = writeParamToMemory(
                        param_value_size,
                        version,
                        param_value_size_ret,
                        ptr );
                    override = true;
                }
            }

            delete [] deviceVersion;
            deviceVersion = NULL;
        }
        break;
    case CL_DEVICE_OPENCL_C_NUMERIC_VERSION_KHR:
        if( m_Config.Emulate_cl_khr_extended_versioning )
        {
            char*   deviceOpenCLCVersion = NULL;

            errorCode = allocateAndGetDeviceInfoString(
                device,
                CL_DEVICE_OPENCL_C_VERSION,
                deviceOpenCLCVersion );
            if( errorCode == CL_SUCCESS && deviceOpenCLCVersion )
            {
                // According to the spec, the OpenCL C version string should have the form:
                //   OpenCL C <Major>.<Minor> <Vendor Specific Info>
                size_t  major = 0;
                size_t  minor = 0;
                if( getMajorMinorVersionFromString(
                        "OpenCL C ",
                        deviceOpenCLCVersion,
                        major,
                        minor ) )
                {
                    cl_version_khr* ptr = (cl_version_khr*)param_value;
                    cl_version_khr  version = CL_MAKE_VERSION_KHR( major, minor, 0 );
                    errorCode = writeParamToMemory(
                        param_value_size,
                        version,
                        param_value_size_ret,
                        ptr );
                    override = true;
                }
            }

            delete [] deviceOpenCLCVersion;
            deviceOpenCLCVersion = NULL;
        }
        break;
    case CL_DEVICE_EXTENSIONS_WITH_VERSION_KHR:
        if( m_Config.Emulate_cl_khr_extended_versioning )
        {
            std::string deviceExtensions;
            if( m_Config.Emulate_cl_khr_extended_versioning &&
                !checkDeviceForExtension( device, "cl_khr_extended_versioning") )
            {
                deviceExtensions += "cl_khr_extended_versioning ";
            }
            if( m_Config.Emulate_cl_intel_unified_shared_memory &&
                !checkDeviceForExtension( device, "cl_intel_unified_shared_memory") )
            {
                deviceExtensions += "cl_intel_unified_shared_memory ";
            }

            char*   tempDeviceExtensions = NULL;

            allocateAndGetDeviceInfoString(
                device,
                CL_DEVICE_EXTENSIONS,
                tempDeviceExtensions );
            deviceExtensions += tempDeviceExtensions;

            // Parse the extension string even if the query returned an error.
            // In this case we will simply return that zero extensions are supported.
            cl_name_version_khr*    ptr = (cl_name_version_khr*)param_value;
            errorCode = parseExtensionString(
                deviceExtensions.c_str(),
                ptr,
                param_value_size,
                param_value_size_ret );
            override = true;

            delete [] tempDeviceExtensions;
            tempDeviceExtensions = NULL;
        }
        break;
    case CL_DEVICE_ILS_WITH_VERSION_KHR:
        if( m_Config.Emulate_cl_khr_extended_versioning )
        {
            char*   deviceILs = NULL;

            allocateAndGetDeviceInfoString(
                device,
                CL_DEVICE_IL_VERSION,
                deviceILs );

            // Parse the extension string even if the query returned an error.
            // In this case we will simply return that zero ILs are supported.
            cl_name_version_khr*    ptr = (cl_name_version_khr*)param_value;
            errorCode = parseILString(
                deviceILs,
                ptr,
                param_value_size,
                param_value_size_ret );
            override = true;

            delete [] deviceILs;
            deviceILs = NULL;
        }
        break;
    case CL_DEVICE_BUILT_IN_KERNELS_WITH_VERSION_KHR:
        if( m_Config.Emulate_cl_khr_extended_versioning )
        {
            char*   deviceBuiltInKernels = NULL;

            allocateAndGetDeviceInfoString(
                device,
                CL_DEVICE_BUILT_IN_KERNELS,
                deviceBuiltInKernels );

            // Parse the built-in kernels string even if the query returned
            // an error.  In this case we will simply return that zero
            // built-in kernels are supported.
            cl_name_version_khr*    ptr = (cl_name_version_khr*)param_value;
            errorCode = parseBuiltInKernelsString(
                deviceBuiltInKernels,
                ptr,
                param_value_size,
                param_value_size_ret );
            override = true;

            delete [] deviceBuiltInKernels;
            deviceBuiltInKernels = NULL;
        }
        break;
    case CL_DRIVER_VERSION:
        if( !m_Config.DriverVersion.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.DriverVersion,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_HOST_MEM_CAPABILITIES_INTEL:
    case CL_DEVICE_DEVICE_MEM_CAPABILITIES_INTEL:
    case CL_DEVICE_SINGLE_DEVICE_SHARED_MEM_CAPABILITIES_INTEL:
    case CL_DEVICE_CROSS_DEVICE_SHARED_MEM_CAPABILITIES_INTEL:
    case CL_DEVICE_SHARED_SYSTEM_MEM_CAPABILITIES_INTEL:
        if( m_Config.Emulate_cl_intel_unified_shared_memory )
        {
            // Shorthand:
            const cl_bitfield acc = CL_UNIFIED_SHARED_MEMORY_ACCESS_INTEL;
            const cl_bitfield ato = CL_UNIFIED_SHARED_MEMORY_ATOMIC_ACCESS_INTEL;
            const cl_bitfield cacc = CL_UNIFIED_SHARED_MEMORY_CONCURRENT_ACCESS_INTEL;
            const cl_bitfield cato = CL_UNIFIED_SHARED_MEMORY_CONCURRENT_ATOMIC_ACCESS_INTEL;

            // Caps:
            cl_device_unified_shared_memory_capabilities_intel hostCaps = 0;
            cl_device_unified_shared_memory_capabilities_intel deviceCaps = 0;
            cl_device_unified_shared_memory_capabilities_intel sdSharedCaps = 0;
            cl_device_unified_shared_memory_capabilities_intel cdSharedCaps = 0;
            cl_device_unified_shared_memory_capabilities_intel sysSharedCaps = 0;

            cl_device_svm_capabilities svmCaps = 0;
            dispatch().clGetDeviceInfo(
                device,
                CL_DEVICE_SVM_CAPABILITIES,
                sizeof(svmCaps),
                &svmCaps,
                NULL );
            if( svmCaps & CL_DEVICE_SVM_FINE_GRAIN_SYSTEM )
            {
                //log( "Returning USM caps for: System SVM\n" );
                hostCaps =      acc | ato | cacc;
                deviceCaps =    acc | ato;
                sdSharedCaps =  acc | ato | cacc;
                cdSharedCaps =  acc | ato | cacc;
                sysSharedCaps = acc | ato | cacc;
                if( svmCaps & CL_DEVICE_SVM_ATOMICS )
                {
                    hostCaps |=      cato;
                    deviceCaps |=    cato;
                    sdSharedCaps |=  cato;
                    cdSharedCaps |=  cato;
                    sysSharedCaps |= cato;
                }
            }
            else if( svmCaps & CL_DEVICE_SVM_FINE_GRAIN_BUFFER )
            {
                //log( "Returning USM caps for: Fine Grain Buffer SVM\n" );
                hostCaps =      acc | ato | cacc;
                deviceCaps =    acc | ato;
                sdSharedCaps =  acc | ato | cacc;
                cdSharedCaps =  acc | ato | cacc;
                if( svmCaps & CL_DEVICE_SVM_ATOMICS )
                {
                    hostCaps |=     cato;
                    deviceCaps |=   cato;
                    sdSharedCaps |= cato;
                    cdSharedCaps |=   cato;
                }
            }
            else if( svmCaps & CL_DEVICE_SVM_COARSE_GRAIN_BUFFER )
            {
                //log( "Returning USM caps for: Coarse Grain Buffer SVM\n" );
                deviceCaps = acc | ato;
            }

            cl_device_unified_shared_memory_capabilities_intel*    ptr =
                (cl_device_unified_shared_memory_capabilities_intel*)param_value;

            switch( param_name )
            {
            case CL_DEVICE_HOST_MEM_CAPABILITIES_INTEL:
                errorCode = writeParamToMemory(
                    param_value_size,
                    hostCaps,
                    param_value_size_ret,
                    ptr );
                override = true;
                break;
            case CL_DEVICE_DEVICE_MEM_CAPABILITIES_INTEL:
                errorCode = writeParamToMemory(
                    param_value_size,
                    deviceCaps,
                    param_value_size_ret,
                    ptr );
                override = true;
                break;
            case CL_DEVICE_SINGLE_DEVICE_SHARED_MEM_CAPABILITIES_INTEL:
                errorCode = writeParamToMemory(
                    param_value_size,
                    sdSharedCaps,
                    param_value_size_ret,
                    ptr );
                override = true;
                break;
            case CL_DEVICE_CROSS_DEVICE_SHARED_MEM_CAPABILITIES_INTEL:
                errorCode = writeParamToMemory(
                    param_value_size,
                    cdSharedCaps,
                    param_value_size_ret,
                    ptr );
                override = true;
                break;
            case CL_DEVICE_SHARED_SYSTEM_MEM_CAPABILITIES_INTEL:
                errorCode = writeParamToMemory(
                    param_value_size,
                    sysSharedCaps,
                    param_value_size_ret,
                    ptr );
                override = true;
                break;
            default:
                break;
            }
        }
        break;
    case CL_DEVICE_SEMAPHORE_TYPES_KHR:
        if( m_Config.Emulate_cl_khr_semaphore )
        {
            // If we decide to emulate multiple semaphore types we will need
            // to return an array, but for now we can return just the binary
            // semaphore type.
            auto    ptr = (cl_semaphore_type_khr*)param_value;
            cl_semaphore_type_khr type = CL_SEMAPHORE_TYPE_BINARY_KHR;
            errorCode = writeParamToMemory(
                param_value_size,
                type,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    default:
        break;
    }

    return override;
}